

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O3

void __thiscall Application::queryEnterOrder(Application *this)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  string *this_00;
  Message order;
  undefined1 local_2c0 [344];
  Message local_168 [344];
  
  iVar3 = queryVersion(this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nNewOrderSingle\n",0x10);
  FIX::Message::Message(local_168);
  switch(iVar3) {
  case 0x28:
    queryNewOrderSingle40((NewOrderSingle *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x29:
    queryNewOrderSingle41((NewOrderSingle *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x2a:
    queryNewOrderSingle42((NewOrderSingle *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x2b:
    queryNewOrderSingle43((NewOrderSingle *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  case 0x2c:
    queryNewOrderSingle44((NewOrderSingle *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
    break;
  default:
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"No test for version ",0x14);
    plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cerr,iVar3);
    std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
    std::ostream::put((char)plVar4);
    std::ostream::flush();
    goto LAB_00110e2d;
  case 0x32:
    queryNewOrderSingle50((NewOrderSingle *)local_2c0,this);
    FIX::Message::operator=(local_168,(Message *)local_2c0);
  }
  FIX::Message::~Message((Message *)local_2c0);
LAB_00110e2d:
  pcVar1 = local_2c0 + 0x10;
  this_00 = (string *)local_2c0;
  local_2c0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>(this_00,"Send order","");
  bVar2 = queryConfirm((Application *)this_00,(string *)local_2c0);
  if ((pointer)local_2c0._0_8_ != pcVar1) {
    operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
  }
  if (bVar2) {
    local_2c0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2c0,"");
    FIX::Session::sendToTarget(local_168,(string *)local_2c0);
    if ((pointer)local_2c0._0_8_ != pcVar1) {
      operator_delete((void *)local_2c0._0_8_,local_2c0._16_8_ + 1);
    }
  }
  FIX::Message::~Message(local_168);
  return;
}

Assistant:

void Application::queryEnterOrder() {
  int version = queryVersion();
  std::cout << "\nNewOrderSingle\n";
  FIX::Message order;

  switch (version) {
  case 40:
    order = queryNewOrderSingle40();
    break;
  case 41:
    order = queryNewOrderSingle41();
    break;
  case 42:
    order = queryNewOrderSingle42();
    break;
  case 43:
    order = queryNewOrderSingle43();
    break;
  case 44:
    order = queryNewOrderSingle44();
    break;
  case 50:
    order = queryNewOrderSingle50();
    break;
  default:
    std::cerr << "No test for version " << version << std::endl;
    break;
  }

  if (queryConfirm("Send order")) {
    FIX::Session::sendToTarget(order);
  }
}